

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::TableUnPackToSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool inclass,
          IDLOptions *opts)

{
  char *__rhs;
  string local_190;
  string local_170;
  byte local_149;
  string local_148;
  byte local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IDLOptions *local_30;
  IDLOptions *opts_local;
  StructDef *pSStack_20;
  bool inclass_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_112 = 0;
  local_149 = 0;
  local_30 = opts;
  opts_local._7_1_ = inclass;
  pSStack_20 = struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (inclass) {
    std::allocator<char>::allocator();
    local_112 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  }
  else {
    Name_abi_cxx11_(&local_148,this,&struct_def->super_Definition);
    local_149 = 1;
    std::operator+(&local_110,&local_148,"::");
  }
  std::operator+(&local_f0,"void ",&local_110);
  std::operator+(&local_d0,&local_f0,"UnPackTo(");
  Name_abi_cxx11_(&local_190,this,&pSStack_20->super_Definition);
  NativeName(&local_170,&local_190,pSStack_20,local_30);
  std::operator+(&local_b0,&local_d0,&local_170);
  std::operator+(&local_90,&local_b0," *");
  std::operator+(&local_70,&local_90,"_o, const ::flatbuffers::resolver_function_t *_resolver");
  __rhs = "";
  if ((opts_local._7_1_ & 1) != 0) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(__return_storage_ptr__,&local_50,") const");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  if ((local_149 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_148);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator(&local_111);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TableUnPackToSignature(const StructDef &struct_def, bool inclass,
                                     const IDLOptions &opts) {
    return "void " + (inclass ? "" : Name(struct_def) + "::") + "UnPackTo(" +
           NativeName(Name(struct_def), &struct_def, opts) + " *" +
           "_o, const ::flatbuffers::resolver_function_t *_resolver" +
           (inclass ? " = nullptr" : "") + ") const";
  }